

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.h
# Opt level: O0

uint __thiscall tri_cc_t::fnext(tri_cc_t *this,uint t)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  runtime_error *this_00;
  const_reference pvVar4;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  uint local_14;
  tri_cc_t *ptStack_10;
  uint t_local;
  tri_cc_t *this_local;
  
  local_14 = t;
  ptStack_10 = this;
  sVar2 = std::vector<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>::size(&this->m_tris);
  if ((t < sVar2) && (bVar1 = has_fnext(this,local_14), bVar1)) {
    pvVar4 = std::vector<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>::operator[]
                       (&this->m_tris,(ulong)local_14);
    return pvVar4->fnext;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,"Failed to assert condition ");
  poVar3 = std::operator<<(poVar3,"is_in_range(t,0,m_tris.size()) && has_fnext(t)");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"at (");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.h"
                          );
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,"fnext");
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x44);
  std::operator<<(poVar3,") \n ");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this_00,local_1d0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline uint fnext ( uint t ) const {ASSERT(is_in_range(t,0,m_tris.size()) && has_fnext(t));return m_tris[t].fnext;}